

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
DirectChainedMap<TypeLookupResult>::insert
          (DirectChainedMap<TypeLookupResult> *this,uint hash,TypeLookupResult value)

{
  Node *pNVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  Node *pNVar5;
  
  if (this->bucketCount <= (this->count >> 2) + this->count) {
    rehash(this);
  }
  this->count = this->count + 1;
  lVar4 = (ulong)(this->bucketCount - 1 & hash) * 0x20;
  pNVar1 = this->data + lVar4;
  if (*(long *)(this->data + lVar4 + 0x18) == 0) {
    *(uint *)pNVar1 = hash;
    pNVar5 = pNVar1;
  }
  else {
    iVar3 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x20);
    pNVar5 = (Node *)CONCAT44(extraout_var,iVar3);
    *(uint *)pNVar5 = *(uint *)pNVar1;
    uVar2 = *(undefined8 *)(pNVar1 + 0x10);
    *(undefined8 *)(pNVar5 + 8) = *(undefined8 *)(pNVar1 + 8);
    *(undefined8 *)(pNVar5 + 0x10) = uVar2;
    *(undefined8 *)(pNVar5 + 0x18) = *(undefined8 *)(pNVar1 + 0x18);
    *(uint *)pNVar1 = hash;
  }
  *(TypeBase **)(pNVar1 + 8) = value.type;
  *(AliasData **)(pNVar1 + 0x10) = value.alias;
  *(Node **)(pNVar1 + 0x18) = pNVar5;
  return;
}

Assistant:

void insert(unsigned hash, Value value)
	{
		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		count++;

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = hash & bucketMask;

		Node *target = &data[bucket];

		if(target->next == NULL)
		{
			target->hash = hash;
			target->value = value;
			target->next = target; // Cycle lets us know that this is the last node
		}
		else
		{
			Node *n = (Node*)allocator->alloc(sizeof(Node));

			n->hash = target->hash;
			n->value = target->value;
			n->next = target->next;

			target->hash = hash;
			target->value = value;
			target->next = n;
		}
	}